

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O0

void __thiscall n_pca::NPca::setTrainMatrix(NPca *this,string *train_config_path)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  istream *piVar6;
  char *pcVar7;
  size_type sVar8;
  reference pvVar9;
  Scalar *pSVar10;
  int local_490;
  int local_48c;
  int j;
  int i;
  int local_46c;
  value_type local_468 [8];
  Mat reshap_image;
  Exception e;
  allocator local_369;
  string local_368 [32];
  string local_348 [96];
  Mat local_2e8 [8];
  Mat image;
  int local_2dc;
  undefined1 local_288 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  read_data;
  vector<cv::Mat,_std::allocator<cv::Mat>_> image_data_;
  int size;
  int count;
  string input_str;
  istream local_220 [8];
  ifstream file;
  string *train_config_path_local;
  NPca *this_local;
  
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    printf("couldn\'t find train_config_path\n");
  }
  else {
    uVar5 = std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_220,uVar5,8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      uVar5 = std::__cxx11::string::c_str();
      printf("couldn\'t open train_config_path: %s\n",uVar5);
    }
    else {
      std::__cxx11::string::string((string *)&size);
      iVar3 = this->n_config_->image_height_ * this->n_config_->image_width_;
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                 &read_data.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_220,(string *)&size);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
        if (!bVar2) break;
        NConfig::n_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_288,this->n_config_,(string *)&size,' ');
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_288);
        if (1 < sVar8) {
          cv::Mat::Mat(local_2e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_288,0);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_368,pcVar7,&local_369);
          cv::imread(local_348,(int)local_368);
          cv::Mat::operator=(local_2e8,(Mat *)local_348);
          cv::Mat::~Mat((Mat *)local_348);
          std::__cxx11::string::~string(local_368);
          std::allocator<char>::~allocator((allocator<char> *)&local_369);
          bVar1 = cv::Mat::empty();
          if ((bVar1 & 1) == 0) {
            if ((local_2dc != this->n_config_->image_width_) ||
               (_image != this->n_config_->image_height_)) {
              n_resize(this,local_2e8);
            }
            cv::Mat::reshape((int)local_468,(int)local_2e8);
            std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back
                      ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                       &read_data.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_468);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_288,1);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            local_46c = atoi(pcVar7);
            std::vector<int,_std::allocator<int>_>::push_back(&this->train_label_,&local_46c);
            cv::Mat::~Mat(local_468);
          }
          cv::Mat::~Mat(local_2e8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_288);
      }
      sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                        ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                         &read_data.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                ((ConstantReturnType *)&j,sVar8,(long)iVar3);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                ((Matrix<double,_1,_1,0,_1,_1> *)&this->train_matrix_,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&j);
      for (local_48c = 0;
          sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                             &read_data.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage),
          (ulong)(long)local_48c < sVar8; local_48c = local_48c + 1) {
        for (local_490 = 0; local_490 < iVar3; local_490 = local_490 + 1) {
          pvVar9 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                             ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                              &read_data.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_48c);
          bVar1 = *(byte *)(*(long *)(pvVar9 + 0x10) + (long)local_490);
          pSVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                              (&(this->train_matrix_).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
                               (long)local_48c,(long)local_490);
          *pSVar10 = (double)bVar1;
        }
      }
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                 &read_data.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&size);
    }
    std::ifstream::~ifstream(local_220);
  }
  return;
}

Assistant:

void NPca::setTrainMatrix(const string train_config_path)
{
    if (train_config_path.length() <= 0)
    {
        printf("couldn't find train_config_path\n");
        return;
    }

    ifstream file(train_config_path.c_str());

    if (!file.is_open())
    {
        printf("couldn't open train_config_path: %s\n", train_config_path.c_str());
        return;
    }

    string input_str;
    int count = 0;
    int size = n_config_->image_height_ * n_config_->image_width_;
    vector<Mat> image_data_;

    while (getline(file, input_str))
    {
        vector<string> read_data = n_config_->n_split(input_str, ' ');
        if (read_data.size() < 2)
            continue;
        Mat image;
        try{
            image = imread(read_data[0].c_str(), IMREAD_GRAYSCALE);
            if (image.empty())
                continue;
        } catch (Exception e) {
            continue;
        }

        // n_resize
        if (image.cols != n_config_->image_width_ || image.rows != n_config_->image_height_)
        {
            n_resize(image);
        }

        Mat reshap_image = image.reshape(0, 1);
        image_data_.push_back(reshap_image);
        train_label_.push_back(atoi(read_data[1].c_str()));
    }
    // set train_matrix
    train_matrix_ = MatrixXd::Zero(image_data_.size(), size);

    for (int i = 0; i < image_data_.size(); i++)
    {
        for (int j = 0; j < size; j++)
        {
            train_matrix_.coeffRef(i, j) = image_data_[i].data[j];
        }
    }
}